

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O2

UBool __thiscall
icu_63::TimeArrayTimeZoneRule::isEquivalentTo(TimeArrayTimeZoneRule *this,TimeZoneRule *other)

{
  double *pdVar1;
  _func_int **pp_Var2;
  uint uVar3;
  bool bVar4;
  UBool UVar5;
  uint uVar6;
  ulong uVar7;
  
  if (this == (TimeArrayTimeZoneRule *)other) {
    return '\x01';
  }
  bVar4 = std::type_info::operator!=
                    ((type_info *)(this->super_TimeZoneRule).super_UObject._vptr_UObject[-1],
                     (type_info *)(other->super_UObject)._vptr_UObject[-1]);
  if (((bVar4) ||
      (UVar5 = TimeZoneRule::isEquivalentTo(&this->super_TimeZoneRule,other), UVar5 == '\0')) ||
     (this->fTimeRuleType != *(TimeRuleType *)&other[1].super_UObject._vptr_UObject)) {
    uVar6 = 0;
  }
  else {
    uVar3 = this->fNumStartTimes;
    uVar6 = 0;
    if (uVar3 == *(uint *)((long)&other[1].super_UObject._vptr_UObject + 4)) {
      if ((int)uVar3 < 1) {
        uVar3 = uVar6;
      }
      uVar7 = 0;
      while (uVar3 != uVar7) {
        pdVar1 = this->fStartTimes + uVar7;
        uVar6 = 0;
        pp_Var2 = other[1].fName.super_Replaceable.super_UObject._vptr_UObject + uVar7;
        uVar7 = uVar7 + 1;
        if ((*pdVar1 != (double)*pp_Var2) || (NAN(*pdVar1) || NAN((double)*pp_Var2)))
        goto LAB_0020e7df;
      }
      uVar6 = 1;
    }
  }
LAB_0020e7df:
  return (UBool)uVar6;
}

Assistant:

UBool
TimeArrayTimeZoneRule::isEquivalentTo(const TimeZoneRule& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (typeid(*this) != typeid(other) || TimeZoneRule::isEquivalentTo(other) == FALSE) {
        return FALSE;
    }
    TimeArrayTimeZoneRule* that = (TimeArrayTimeZoneRule*)&other;
    if (fTimeRuleType != that->fTimeRuleType ||
        fNumStartTimes != that->fNumStartTimes) {
        return FALSE;
    }
    // Compare start times
    UBool res = TRUE;
    for (int32_t i = 0; i < fNumStartTimes; i++) {
        if (fStartTimes[i] != that->fStartTimes[i]) {
            res = FALSE;
            break;
        }
    }
    return res;
}